

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_ssse3_intr.c
# Opt level: O2

void ihevc_weighted_pred_bi_ssse3
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 wgt0,WORD32 off0,WORD32 wgt1,WORD32 off1,WORD32 shift,
               WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  unkbyte10 Var25;
  unkbyte10 Var26;
  unkbyte10 Var27;
  unkbyte10 Var28;
  int iVar29;
  long lVar30;
  WORD16 *pWVar31;
  long lVar32;
  long lVar33;
  WORD16 *pWVar34;
  int iVar35;
  int iVar36;
  short sVar37;
  undefined4 uVar38;
  short sVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  short sVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar47;
  int iVar49;
  int iVar50;
  undefined1 auVar48 [16];
  int iVar51;
  short sVar53;
  undefined1 auVar52 [16];
  short sVar55;
  short sVar56;
  undefined1 auVar54 [16];
  int iVar57;
  undefined1 auVar60 [16];
  int iVar61;
  undefined1 auVar64 [16];
  int iVar65;
  short sVar67;
  int iVar68;
  int iVar69;
  short sVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar62 [12];
  undefined1 auVar63 [16];
  undefined1 auVar66 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [16];
  undefined1 auVar79 [12];
  undefined1 auVar80 [16];
  
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                  ,0x2f7,
                  "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if ((ht & 3U) == 0) {
    iVar35 = off0 + off1 + 1 << ((char)shift - 1U & 0x1f);
    auVar39 = pshuflw(ZEXT416((uint)lvl_shift1),ZEXT416((uint)lvl_shift1),0);
    uVar38 = auVar39._0_4_;
    auVar48._4_4_ = uVar38;
    auVar48._0_4_ = uVar38;
    auVar48._8_4_ = uVar38;
    auVar48._12_4_ = uVar38;
    auVar40 = pshuflw(ZEXT416((uint)wgt0),ZEXT416((uint)wgt0),0);
    auVar41._0_4_ = auVar40._0_4_;
    auVar41._4_4_ = auVar41._0_4_;
    auVar41._8_4_ = auVar41._0_4_;
    auVar41._12_4_ = auVar41._0_4_;
    auVar43 = pshuflw(ZEXT416((uint)lvl_shift2),ZEXT416((uint)lvl_shift2),0);
    uVar38 = auVar43._0_4_;
    auVar74._4_4_ = uVar38;
    auVar74._0_4_ = uVar38;
    auVar74._8_4_ = uVar38;
    auVar74._12_4_ = uVar38;
    auVar44 = pshuflw(ZEXT416((uint)wgt1),ZEXT416((uint)wgt1),0);
    auVar45._0_4_ = auVar44._0_4_;
    auVar45._4_4_ = auVar45._0_4_;
    auVar45._8_4_ = auVar45._0_4_;
    auVar45._12_4_ = auVar45._0_4_;
    sVar37 = auVar40._0_2_;
    sVar42 = auVar40._2_2_;
    sVar53 = auVar39._2_2_ * sVar42;
    auVar40 = pmulhw(auVar48,auVar41);
    iVar36 = CONCAT22(auVar40._6_2_,sVar53);
    Var25 = CONCAT64(CONCAT42(iVar36,auVar40._4_2_),CONCAT22(auVar39._0_2_ * sVar37,sVar53));
    auVar17._4_8_ = (long)((unkuint10)Var25 >> 0x10);
    auVar17._2_2_ = auVar40._2_2_;
    auVar17._0_2_ = auVar39._2_2_ * sVar42;
    sVar53 = auVar44._0_2_;
    sVar46 = auVar44._2_2_;
    sVar55 = auVar43._2_2_ * sVar46;
    auVar44 = pmulhw(auVar74,auVar45);
    iVar51 = CONCAT22(auVar44._6_2_,sVar55);
    Var26 = CONCAT64(CONCAT42(iVar51,auVar44._4_2_),CONCAT22(auVar43._0_2_ * sVar53,sVar55));
    auVar18._4_8_ = (long)((unkuint10)Var26 >> 0x10);
    auVar18._2_2_ = auVar44._2_2_;
    auVar18._0_2_ = auVar43._2_2_ * sVar46;
    iVar47 = iVar35 + CONCAT22(auVar40._0_2_,auVar39._0_2_ * sVar37) +
             CONCAT22(auVar44._0_2_,auVar43._0_2_ * sVar53);
    iVar49 = iVar35 + auVar17._0_4_ + auVar18._0_4_;
    iVar50 = iVar35 + (int)((unkuint10)Var25 >> 0x10) + (int)((unkuint10)Var26 >> 0x10);
    iVar51 = iVar35 + iVar36 + iVar51;
    lVar30 = (long)wd;
    lVar32 = dst_strd * 2 - lVar30;
    if ((wd & 4U) == 0) {
      auVar39 = ZEXT416((uint)shift);
      for (iVar36 = 0; iVar36 < ht; iVar36 = iVar36 + 2) {
        pWVar31 = pi2_src2 + (src_strd2 * 2 - lVar30);
        pWVar34 = pi2_src1 + (src_strd1 * 2 - lVar30);
        for (lVar33 = 0; (int)lVar33 < wd; lVar33 = lVar33 + 8) {
          auVar40 = *(undefined1 (*) [16])(pi2_src1 + lVar33);
          auVar43 = *(undefined1 (*) [16])(pi2_src2 + lVar33);
          auVar44 = *(undefined1 (*) [16])(pi2_src1 + src_strd1 + lVar33);
          auVar48 = *(undefined1 (*) [16])(pi2_src2 + src_strd2 + lVar33);
          sVar55 = auVar40._6_2_ * sVar42;
          sVar73 = auVar43._6_2_ * sVar46;
          sVar56 = auVar44._6_2_ * sVar42;
          sVar67 = auVar48._6_2_ * sVar46;
          auVar74 = pmulhw(auVar40,auVar41);
          auVar75 = pmulhw(auVar43,auVar45);
          auVar76 = pmulhw(auVar44,auVar41);
          auVar77 = pmulhw(auVar48,auVar45);
          iVar61 = CONCAT22(auVar74._8_2_,auVar40._8_2_ * sVar37);
          auVar62._0_8_ = CONCAT26(auVar74._10_2_,CONCAT24(auVar40._10_2_ * sVar42,iVar61));
          auVar62._8_2_ = auVar40._12_2_ * sVar37;
          auVar62._10_2_ = auVar74._12_2_;
          auVar63._12_2_ = auVar40._14_2_ * sVar42;
          auVar63._0_12_ = auVar62;
          auVar63._14_2_ = auVar74._14_2_;
          iVar78 = CONCAT22(auVar75._8_2_,auVar43._8_2_ * sVar53);
          auVar79._0_8_ = CONCAT26(auVar75._10_2_,CONCAT24(auVar43._10_2_ * sVar46,iVar78));
          auVar79._8_2_ = auVar43._12_2_ * sVar53;
          auVar79._10_2_ = auVar75._12_2_;
          auVar80._12_2_ = auVar43._14_2_ * sVar46;
          auVar80._0_12_ = auVar79;
          auVar80._14_2_ = auVar75._14_2_;
          iVar57 = CONCAT22(auVar76._8_2_,auVar44._8_2_ * sVar37);
          auVar58._0_8_ = CONCAT26(auVar76._10_2_,CONCAT24(auVar44._10_2_ * sVar42,iVar57));
          auVar58._8_2_ = auVar44._12_2_ * sVar37;
          auVar58._10_2_ = auVar76._12_2_;
          auVar59._12_2_ = auVar44._14_2_ * sVar42;
          auVar59._0_12_ = auVar58;
          auVar59._14_2_ = auVar76._14_2_;
          iVar68 = CONCAT22(auVar77._8_2_,auVar48._8_2_ * sVar53);
          auVar70._0_8_ = CONCAT26(auVar77._10_2_,CONCAT24(auVar48._10_2_ * sVar46,iVar68));
          auVar70._8_2_ = auVar48._12_2_ * sVar53;
          auVar70._10_2_ = auVar77._12_2_;
          auVar72._12_2_ = auVar48._14_2_ * sVar46;
          auVar72._0_12_ = auVar70;
          auVar72._14_2_ = auVar77._14_2_;
          iVar35 = CONCAT22(auVar74._6_2_,sVar55);
          Var25 = CONCAT64(CONCAT42(iVar35,auVar74._4_2_),CONCAT22(auVar40._4_2_ * sVar37,sVar55));
          auVar19._4_8_ = (long)((unkuint10)Var25 >> 0x10);
          auVar19._2_2_ = auVar74._2_2_;
          auVar19._0_2_ = auVar40._2_2_ * sVar42;
          iVar29 = CONCAT22(auVar75._6_2_,sVar73);
          Var26 = CONCAT64(CONCAT42(iVar29,auVar75._4_2_),CONCAT22(auVar43._4_2_ * sVar53,sVar73));
          auVar20._4_8_ = (long)((unkuint10)Var26 >> 0x10);
          auVar20._2_2_ = auVar75._2_2_;
          auVar20._0_2_ = auVar43._2_2_ * sVar46;
          iVar65 = CONCAT22(auVar76._6_2_,sVar56);
          Var27 = CONCAT64(CONCAT42(iVar65,auVar76._4_2_),CONCAT22(auVar44._4_2_ * sVar37,sVar56));
          auVar21._4_8_ = (long)((unkuint10)Var27 >> 0x10);
          auVar21._2_2_ = auVar76._2_2_;
          auVar21._0_2_ = auVar44._2_2_ * sVar42;
          iVar69 = CONCAT22(auVar77._6_2_,sVar67);
          Var28 = CONCAT64(CONCAT42(iVar69,auVar77._4_2_),CONCAT22(auVar48._4_2_ * sVar53,sVar67));
          auVar22._4_8_ = (long)((unkuint10)Var28 >> 0x10);
          auVar22._2_2_ = auVar77._2_2_;
          auVar22._0_2_ = auVar48._2_2_ * sVar46;
          auVar52._0_4_ =
               CONCAT22(auVar74._0_2_,auVar40._0_2_ * sVar37) + iVar47 +
               CONCAT22(auVar75._0_2_,auVar43._0_2_ * sVar53) >> auVar39;
          auVar52._4_4_ = auVar19._0_4_ + iVar49 + auVar20._0_4_ >> auVar39;
          auVar52._8_4_ =
               (int)((unkuint10)Var25 >> 0x10) + iVar50 + (int)((unkuint10)Var26 >> 0x10) >> auVar39
          ;
          auVar52._12_4_ = iVar35 + iVar51 + iVar29 >> auVar39;
          auVar54._0_4_ =
               CONCAT22(auVar76._0_2_,auVar44._0_2_ * sVar37) + iVar47 +
               CONCAT22(auVar77._0_2_,auVar48._0_2_ * sVar53) >> auVar39;
          auVar54._4_4_ = auVar21._0_4_ + iVar49 + auVar22._0_4_ >> auVar39;
          auVar54._8_4_ =
               (int)((unkuint10)Var27 >> 0x10) + iVar50 + (int)((unkuint10)Var28 >> 0x10) >> auVar39
          ;
          auVar54._12_4_ = iVar65 + iVar51 + iVar69 >> auVar39;
          auVar64._0_4_ = iVar61 + iVar47 + iVar78 >> auVar39;
          auVar64._4_4_ =
               (int)((ulong)auVar62._0_8_ >> 0x20) + iVar49 + (int)((ulong)auVar79._0_8_ >> 0x20) >>
               auVar39;
          auVar64._8_4_ = auVar62._8_4_ + iVar50 + auVar79._8_4_ >> auVar39;
          auVar64._12_4_ = auVar63._12_4_ + iVar51 + auVar80._12_4_ >> auVar39;
          auVar40 = packssdw(auVar52,auVar64);
          auVar60._0_4_ = iVar57 + iVar47 + iVar68 >> auVar39;
          auVar60._4_4_ =
               (int)((ulong)auVar58._0_8_ >> 0x20) + iVar49 + (int)((ulong)auVar70._0_8_ >> 0x20) >>
               auVar39;
          auVar60._8_4_ = auVar58._8_4_ + iVar50 + auVar70._8_4_ >> auVar39;
          auVar60._12_4_ = auVar59._12_4_ + iVar51 + auVar72._12_4_ >> auVar39;
          sVar55 = auVar40._0_2_;
          sVar67 = auVar40._2_2_;
          sVar5 = auVar40._4_2_;
          sVar7 = auVar40._6_2_;
          sVar9 = auVar40._8_2_;
          sVar11 = auVar40._10_2_;
          sVar13 = auVar40._12_2_;
          sVar15 = auVar40._14_2_;
          auVar43 = packssdw(auVar54,auVar60);
          sVar56 = auVar43._0_2_;
          sVar73 = auVar43._2_2_;
          sVar6 = auVar43._4_2_;
          sVar8 = auVar43._6_2_;
          sVar10 = auVar43._8_2_;
          sVar12 = auVar43._10_2_;
          sVar14 = auVar43._12_2_;
          sVar16 = auVar43._14_2_;
          *(ulong *)(pu1_dst + lVar33) =
               CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar40[0xe] - (0xff < sVar15),
                        CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar40[0xc] - (0xff < sVar13),
                                 CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar40[10] -
                                          (0xff < sVar11),
                                          CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar40[8] -
                                                   (0xff < sVar9),
                                                   CONCAT13((0 < sVar7) * (sVar7 < 0x100) *
                                                            auVar40[6] - (0xff < sVar7),
                                                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                     auVar40[4] - (0xff < sVar5),
                                                                     CONCAT11((0 < sVar67) *
                                                                              (sVar67 < 0x100) *
                                                                              auVar40[2] -
                                                                              (0xff < sVar67),
                                                                              (0 < sVar55) *
                                                                              (sVar55 < 0x100) *
                                                                              auVar40[0] -
                                                                              (0xff < sVar55))))))))
          ;
          *(ulong *)(pu1_dst + lVar33 + dst_strd) =
               CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar43[0xe] - (0xff < sVar16),
                        CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar43[0xc] - (0xff < sVar14),
                                 CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar43[10] -
                                          (0xff < sVar12),
                                          CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar43[8] -
                                                   (0xff < sVar10),
                                                   CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                            auVar43[6] - (0xff < sVar8),
                                                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                     auVar43[4] - (0xff < sVar6),
                                                                     CONCAT11((0 < sVar73) *
                                                                              (sVar73 < 0x100) *
                                                                              auVar43[2] -
                                                                              (0xff < sVar73),
                                                                              (0 < sVar56) *
                                                                              (sVar56 < 0x100) *
                                                                              auVar43[0] -
                                                                              (0xff < sVar56))))))))
          ;
          pWVar31 = pWVar31 + 8;
          pWVar34 = pWVar34 + 8;
        }
        pu1_dst = pu1_dst + lVar33 + lVar32;
        pi2_src2 = pWVar31;
        pi2_src1 = pWVar34;
      }
    }
    else {
      auVar39 = ZEXT416((uint)shift);
      for (iVar36 = 0; iVar36 < ht; iVar36 = iVar36 + 2) {
        pWVar31 = pi2_src2 + (src_strd2 * 2 - lVar30);
        pWVar34 = pi2_src1 + (src_strd1 * 2 - lVar30);
        for (lVar33 = 0; (int)lVar33 < wd; lVar33 = lVar33 + 4) {
          uVar1 = *(undefined8 *)(pi2_src1 + src_strd1 + lVar33);
          uVar2 = *(undefined8 *)(pi2_src1 + lVar33);
          auVar43._8_8_ = uVar1;
          auVar43._0_8_ = uVar2;
          uVar3 = *(undefined8 *)(pi2_src2 + src_strd2 + lVar33);
          uVar4 = *(undefined8 *)(pi2_src2 + lVar33);
          auVar44._8_8_ = uVar3;
          auVar44._0_8_ = uVar4;
          sVar55 = sVar42 * (short)((ulong)uVar2 >> 0x30);
          sVar56 = sVar46 * (short)((ulong)uVar4 >> 0x30);
          auVar40 = pmulhw(auVar43,auVar41);
          auVar43 = pmulhw(auVar44,auVar45);
          iVar65 = CONCAT22(auVar40._8_2_,sVar37 * (short)uVar1);
          auVar66._0_8_ =
               CONCAT26(auVar40._10_2_,CONCAT24(sVar42 * (short)((ulong)uVar1 >> 0x10),iVar65));
          auVar66._8_2_ = sVar37 * (short)((ulong)uVar1 >> 0x20);
          auVar66._10_2_ = auVar40._12_2_;
          auVar75._12_2_ = sVar42 * (short)((ulong)uVar1 >> 0x30);
          auVar75._0_12_ = auVar66;
          auVar75._14_2_ = auVar40._14_2_;
          iVar69 = CONCAT22(auVar43._8_2_,sVar53 * (short)uVar3);
          auVar71._0_8_ =
               CONCAT26(auVar43._10_2_,CONCAT24(sVar46 * (short)((ulong)uVar3 >> 0x10),iVar69));
          auVar71._8_2_ = sVar53 * (short)((ulong)uVar3 >> 0x20);
          auVar71._10_2_ = auVar43._12_2_;
          auVar77._12_2_ = sVar46 * (short)((ulong)uVar3 >> 0x30);
          auVar77._0_12_ = auVar71;
          auVar77._14_2_ = auVar43._14_2_;
          iVar35 = CONCAT22(auVar40._6_2_,sVar55);
          Var25 = CONCAT64(CONCAT42(iVar35,auVar40._4_2_),
                           CONCAT22(sVar37 * (short)((ulong)uVar2 >> 0x20),sVar55));
          auVar23._4_8_ = (long)((unkuint10)Var25 >> 0x10);
          auVar23._2_2_ = auVar40._2_2_;
          auVar23._0_2_ = sVar42 * (short)((ulong)uVar2 >> 0x10);
          iVar29 = CONCAT22(auVar43._6_2_,sVar56);
          Var26 = CONCAT64(CONCAT42(iVar29,auVar43._4_2_),
                           CONCAT22(sVar53 * (short)((ulong)uVar4 >> 0x20),sVar56));
          auVar24._4_8_ = (long)((unkuint10)Var26 >> 0x10);
          auVar24._2_2_ = auVar43._2_2_;
          auVar24._0_2_ = sVar46 * (short)((ulong)uVar4 >> 0x10);
          auVar40._0_4_ =
               CONCAT22(auVar40._0_2_,sVar37 * (short)uVar2) + iVar47 +
               CONCAT22(auVar43._0_2_,sVar53 * (short)uVar4) >> auVar39;
          auVar40._4_4_ = auVar23._0_4_ + iVar49 + auVar24._0_4_ >> auVar39;
          auVar40._8_4_ =
               (int)((unkuint10)Var25 >> 0x10) + iVar50 + (int)((unkuint10)Var26 >> 0x10) >> auVar39
          ;
          auVar40._12_4_ = iVar35 + iVar51 + iVar29 >> auVar39;
          auVar76._0_4_ = iVar65 + iVar47 + iVar69 >> auVar39;
          auVar76._4_4_ =
               (int)((ulong)auVar66._0_8_ >> 0x20) + iVar49 + (int)((ulong)auVar71._0_8_ >> 0x20) >>
               auVar39;
          auVar76._8_4_ = auVar66._8_4_ + iVar50 + auVar71._8_4_ >> auVar39;
          auVar76._12_4_ = auVar75._12_4_ + iVar51 + auVar77._12_4_ >> auVar39;
          auVar40 = packssdw(auVar40,auVar76);
          sVar55 = auVar40._0_2_;
          sVar56 = auVar40._2_2_;
          sVar67 = auVar40._4_2_;
          sVar73 = auVar40._6_2_;
          uVar38 = CONCAT13((0 < sVar73) * (sVar73 < 0x100) * auVar40[6] - (0xff < sVar73),
                            CONCAT12((0 < sVar67) * (sVar67 < 0x100) * auVar40[4] - (0xff < sVar67),
                                     CONCAT11((0 < sVar56) * (sVar56 < 0x100) * auVar40[2] -
                                              (0xff < sVar56),
                                              (0 < sVar55) * (sVar55 < 0x100) * auVar40[0] -
                                              (0xff < sVar55))));
          sVar55 = auVar40._8_2_;
          sVar56 = auVar40._10_2_;
          sVar67 = auVar40._12_2_;
          sVar73 = auVar40._14_2_;
          *(undefined4 *)(pu1_dst + lVar33) = uVar38;
          *(int *)(pu1_dst + lVar33 + dst_strd) =
               (int)(CONCAT17((0 < sVar73) * (sVar73 < 0x100) * auVar40[0xe] - (0xff < sVar73),
                              CONCAT16((0 < sVar67) * (sVar67 < 0x100) * auVar40[0xc] -
                                       (0xff < sVar67),
                                       CONCAT15((0 < sVar56) * (sVar56 < 0x100) * auVar40[10] -
                                                (0xff < sVar56),
                                                CONCAT14((0 < sVar55) * (sVar55 < 0x100) *
                                                         auVar40[8] - (0xff < sVar55),uVar38)))) >>
                    0x20);
          pWVar31 = pWVar31 + 4;
          pWVar34 = pWVar34 + 4;
        }
        pu1_dst = pu1_dst + lVar33 + lVar32;
        pi2_src2 = pWVar31;
        pi2_src1 = pWVar34;
      }
    }
    return;
  }
  __assert_fail("(ht % 4 == 0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_ssse3_intr.c"
                ,0x2f8,
                "void ihevc_weighted_pred_bi_ssse3(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
               );
}

Assistant:

void ihevc_weighted_pred_bi_ssse3(WORD16 *pi2_src1,
                                  WORD16 *pi2_src2,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd1,
                                  WORD32 src_strd2,
                                  WORD32 dst_strd,
                                  WORD32 wgt0,
                                  WORD32 off0,
                                  WORD32 wgt1,
                                  WORD32 off1,
                                  WORD32 shift,
                                  WORD32 lvl_shift1,
                                  WORD32 lvl_shift2,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col, temp;

    __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
    __m128i const_temp_4x32b, lvl_shift1_4x32b, lvl_shift2_4x32b, wgt0_8x16b, wgt1_8x16b;
    __m128i res_temp1_4x32b, res_temp2_4x32b, res_temp3_4x32b, res_temp4_4x32b;

#include <assert.h>
    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 4 == 0); /* checking assumption*/

    temp = (off0 + off1 + 1) << (shift - 1);

    // seting values in register
    lvl_shift1_4x32b = _mm_set1_epi16(lvl_shift1);
    wgt0_8x16b = _mm_set1_epi16(wgt0);
    lvl_shift2_4x32b = _mm_set1_epi16(lvl_shift2);
    wgt1_8x16b = _mm_set1_epi16(wgt1);

    /* lvl_shift1 * wgt0 */
    res_temp1_4x32b = _mm_mullo_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    res_temp2_4x32b = _mm_mulhi_epi16(lvl_shift1_4x32b, wgt0_8x16b);
    /* lvl_shift2 * wgt1 */
    res_temp3_4x32b = _mm_mullo_epi16(lvl_shift2_4x32b, wgt1_8x16b);
    res_temp4_4x32b = _mm_mulhi_epi16(lvl_shift2_4x32b, wgt1_8x16b);

    const_temp_4x32b = _mm_set1_epi32(temp);

    /* lvl_shift1 * wgt0 */
    lvl_shift1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, res_temp2_4x32b);
    /* lvl_shift2 * wgt1 */
    lvl_shift2_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, res_temp4_4x32b);

    if(0 == (wd & 7)) /* wd multiple of 8 case */
    {
        __m128i res_temp5_4x32b, res_temp6_4x32b, res_temp7_4x32b, res_temp8_4x32b;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 8)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                res_temp3_4x32b  = _mm_mullo_epi16(src_temp3_8x16b, wgt0_8x16b);
                res_temp4_4x32b  = _mm_mullo_epi16(src_temp4_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);
                src_temp3_8x16b  = _mm_mulhi_epi16(src_temp3_8x16b, wgt0_8x16b);
                src_temp4_8x16b  = _mm_mulhi_epi16(src_temp4_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp5_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp6_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp7_4x32b = _mm_unpackhi_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp8_4x32b = _mm_unpackhi_epi16(res_temp4_4x32b, src_temp4_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);
                res_temp3_4x32b = _mm_unpacklo_epi16(res_temp3_4x32b, src_temp3_8x16b);
                res_temp4_4x32b = _mm_unpacklo_epi16(res_temp4_4x32b, src_temp4_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, lvl_shift1_4x32b);
                res_temp6_4x32b = _mm_add_epi32(res_temp6_4x32b, lvl_shift2_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, lvl_shift1_4x32b);
                res_temp8_4x32b = _mm_add_epi32(res_temp8_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);
                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);
                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                /* Next 4 Pixels */
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, res_temp6_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, res_temp8_4x32b);
                res_temp5_4x32b = _mm_add_epi32(res_temp5_4x32b, const_temp_4x32b);
                res_temp7_4x32b = _mm_add_epi32(res_temp7_4x32b, const_temp_4x32b);
                res_temp5_4x32b = _mm_srai_epi32(res_temp5_4x32b,  shift);
                res_temp7_4x32b = _mm_srai_epi32(res_temp7_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp5_4x32b);
                res_temp3_4x32b = _mm_packs_epi32(res_temp3_4x32b, res_temp7_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);
                res_temp3_4x32b = _mm_packus_epi16(res_temp3_4x32b, res_temp3_4x32b);

                /* store four 8-bit output values  */
                _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), res_temp1_4x32b); /* row = 0*/
                _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), res_temp3_4x32b); /* row = 1*/

                pi2_src1 += 8;  /* Pointer update */
                pi2_src2 += 8;  /* Pointer update */
                pu1_dst  += 8;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }
    else /* wd multiple of 4 case */
    {
        WORD32 dst0, dst1;
        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1)); /* row = 0 */
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2)); /* row = 0 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 1 * src_strd1)); /* row = 1 */
                src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 1 * src_strd2)); /* row = 1 */

                /* 2 rows together */
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);

                /*i4_tmp = (pi2_src[col]) * wgt*/ /* Lower 16 bit */
                res_temp1_4x32b  = _mm_mullo_epi16(src_temp1_8x16b, wgt0_8x16b);
                res_temp2_4x32b  = _mm_mullo_epi16(src_temp2_8x16b, wgt1_8x16b);
                /*i4_tmp = (pi2_src[col] ) * wgt*/ /* Higher 16 bit */
                src_temp1_8x16b  = _mm_mulhi_epi16(src_temp1_8x16b, wgt0_8x16b);
                src_temp2_8x16b  = _mm_mulhi_epi16(src_temp2_8x16b, wgt1_8x16b);

                /* Get 32 bit Result */
                res_temp3_4x32b = _mm_unpackhi_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp4_4x32b = _mm_unpackhi_epi16(res_temp2_4x32b, src_temp2_8x16b);

                res_temp1_4x32b = _mm_unpacklo_epi16(res_temp1_4x32b, src_temp1_8x16b);
                res_temp2_4x32b = _mm_unpacklo_epi16(res_temp2_4x32b, src_temp2_8x16b);

                /* (pi2_src[col] + lvl_shift) * wgt */
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, lvl_shift1_4x32b);
                res_temp4_4x32b = _mm_add_epi32(res_temp4_4x32b, lvl_shift2_4x32b);
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, lvl_shift1_4x32b);
                res_temp2_4x32b = _mm_add_epi32(res_temp2_4x32b, lvl_shift2_4x32b);

                /* (pi2_src1[col] + lvl_shift1) * wgt0 + (pi2_src2[col] + lvl_shift2) * wgt1 */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, res_temp2_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, res_temp4_4x32b);

                /* i4_tmp += (off0 + off1 + 1) << (shift - 1); */
                res_temp1_4x32b = _mm_add_epi32(res_temp1_4x32b, const_temp_4x32b);
                res_temp3_4x32b = _mm_add_epi32(res_temp3_4x32b, const_temp_4x32b);

                /* (i4_tmp >> shift) */
                res_temp1_4x32b = _mm_srai_epi32(res_temp1_4x32b,  shift);
                res_temp3_4x32b = _mm_srai_epi32(res_temp3_4x32b,  shift);

                res_temp1_4x32b = _mm_packs_epi32(res_temp1_4x32b, res_temp3_4x32b);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                res_temp1_4x32b = _mm_packus_epi16(res_temp1_4x32b, res_temp1_4x32b);

                dst0 = _mm_cvtsi128_si32(res_temp1_4x32b);

                /* dst row = 1 to 3 */
                res_temp2_4x32b = _mm_shuffle_epi32(res_temp1_4x32b, 1);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(res_temp2_4x32b);

                /* row = 1 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;

                pi2_src1 += 4;  /* Pointer update */
                pi2_src2 += 4;  /* Pointer update */
                pu1_dst  += 4;  /* Pointer update */

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1;  /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2;  /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;   /* Pointer update */

        } /* outer loop ends */
    }

}